

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseReference
                 (char *in,char *end,
                 vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *names)

{
  pointer *pppNVar1;
  iterator iVar2;
  byte bVar3;
  Name *nextName;
  Name *local_38;
  
  if (in != end && in != (char *)0x0) {
    local_38 = (Name *)0x0;
    in = parseName(in,end,&local_38);
    if (local_38 != (Name *)0x0) {
      iVar2._M_current =
           (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>>::
        _M_realloc_insert<ODDLParser::Name*const&>
                  ((vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>> *)names,iVar2,
                   &local_38);
      }
      else {
        *iVar2._M_current = local_38;
        pppNVar1 = &(names->
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
    }
    bVar3 = *in;
    while (bVar3 == 0x2c) {
      if (in != end) {
        do {
          bVar3 = *in;
          if ((((ulong)bVar3 < 0x2d) && ((0x130100000200U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
             ((bVar3 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar3 - 0x5b) & 0x3f) & 1) != 0))))
          goto LAB_0015c885;
          in = (char *)((byte *)in + 1);
        } while (in != end);
        bVar3 = *end;
        in = end;
LAB_0015c885:
        if (bVar3 != 0x2c) {
          return (char *)(byte *)in;
        }
      }
      in = parseName(in,end,&local_38);
      if (local_38 != (Name *)0x0) {
        iVar2._M_current =
             (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>>::
          _M_realloc_insert<ODDLParser::Name*const&>
                    ((vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>> *)names,iVar2,
                     &local_38);
        }
        else {
          *iVar2._M_current = local_38;
          pppNVar1 = &(names->
                      super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      bVar3 = *in;
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseReference(char *in, char *end, std::vector<Name *> &names) {
    if (nullptr == in || in == end) {
        return in;
    }

    Name *nextName(nullptr);
    in = parseName(in, end, &nextName);
    if (nextName) {
        names.push_back(nextName);
    }
    while (Grammar::CommaSeparator[0] == *in) {
        in = getNextSeparator(in, end);
        if (Grammar::CommaSeparator[0] == *in) {
            in = parseName(in, end, &nextName);
            if (nextName) {
                names.push_back(nextName);
            }
        } else {
            break;
        }
    }

    return in;
}